

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O0

shared_ptr<duckdb::ExtraTypeInfo,_true>
duckdb::StringTypeInfo::Deserialize(Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Deserializer *in_RSI;
  element_type *in_RDI;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar1;
  shared_ptr<duckdb::StringTypeInfo,_true> result;
  shared_ptr<duckdb::StringTypeInfo,_true> *in_stack_ffffffffffffff98;
  StringTypeInfo *in_stack_ffffffffffffffa0;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *this;
  StringTypeInfo *in_stack_ffffffffffffffa8;
  shared_ptr<duckdb::StringTypeInfo,_true> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  element_type *in_stack_ffffffffffffffe0;
  field_id_t in_stack_ffffffffffffffee;
  
  operator_new(0x58);
  StringTypeInfo(in_stack_ffffffffffffffa0);
  this = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)&stack0xffffffffffffffe0;
  shared_ptr<duckdb::StringTypeInfo,_true>::shared_ptr<duckdb::StringTypeInfo,_0>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  shared_ptr<duckdb::StringTypeInfo,_true>::operator->
            ((shared_ptr<duckdb::StringTypeInfo,_true> *)this);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_RSI,in_stack_ffffffffffffffee,(char *)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  shared_ptr<duckdb::ExtraTypeInfo,_true>::shared_ptr<duckdb::StringTypeInfo,_0>
            (this,in_stack_ffffffffffffff98);
  shared_ptr<duckdb::StringTypeInfo,_true>::~shared_ptr
            ((shared_ptr<duckdb::StringTypeInfo,_true> *)0xaeaee0);
  sVar1.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar1.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> StringTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<StringTypeInfo>(new StringTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "collation", result->collation);
	return std::move(result);
}